

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elimination_ordering.cpp
# Opt level: O1

void indigox::algorithm::QuickBBOrder(PermutableGraph_p *G,ElimOrder *order)

{
  pointer ppvVar1;
  PermutableGraph_p local_28;
  
  ppvVar1 = (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish != ppvVar1) {
    (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppvVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "To use the QuickBB algorithm, indigoX needs to be built with Java. Will fall back to using the Random algorithm. For shits and giggles."
             ,0x87);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (G->super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (G->super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi;
  if (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  RandomOrder(&local_28,order);
  if (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  }
  return;
}

Assistant:

void QuickBBOrder(PermutableGraph_p G, ElimOrder& order) {
      order.clear();
      
#ifndef BUILD_JAVA
      std::cout << "To use the QuickBB algorithm, indigoX needs to be built with Java. Will fall back to using the Random algorithm. For shits and giggles." << std::endl;
      RandomOrder(G, order);
#else
      String DGFString = G->ToDGFString();
      String EO = utils::GetEliminationOrdering(DGFString);
      
      std::istringstream ss(EO);
      String idx;
      while (std::getline(ss, idx, ' ')) {
        indigox::uid_t i = (indigox::uid_t)std::stoull(idx);
        order.push_back(G->GetVertexByIndex(i).first);
      }
      
#endif
    }